

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mac_meth.c
# Opt level: O0

void * evp_mac_new(void)

{
  void *vmac;
  CRYPTO_RWLOCK *pCVar1;
  size_t unaff_retaddr;
  EVP_MAC *mac;
  char *in_stack_fffffffffffffff8;
  
  vmac = CRYPTO_zalloc(unaff_retaddr,in_stack_fffffffffffffff8,0);
  if (vmac != (void *)0x0) {
    pCVar1 = CRYPTO_THREAD_lock_new();
    *(CRYPTO_RWLOCK **)((long)vmac + 0x28) = pCVar1;
    if (pCVar1 != (CRYPTO_RWLOCK *)0x0) {
      LOCK();
      *(undefined4 *)((long)vmac + 0x20) = 1;
      UNLOCK();
      return vmac;
    }
  }
  evp_mac_free(vmac);
  return (void *)0x0;
}

Assistant:

static void *evp_mac_new(void)
{
    EVP_MAC *mac = NULL;

    if ((mac = OPENSSL_zalloc(sizeof(*mac))) == NULL
        || (mac->lock = CRYPTO_THREAD_lock_new()) == NULL) {
        evp_mac_free(mac);
        return NULL;
    }

    mac->refcnt = 1;

    return mac;
}